

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_os.c
# Opt level: O0

int lj_cf_os_time(lua_State *L)

{
  int iVar1;
  tm ts;
  time_t t;
  int in_stack_ffffffffffffffb8;
  int in_stack_ffffffffffffffbc;
  int in_stack_ffffffffffffffc0;
  int in_stack_ffffffffffffffc4;
  int in_stack_ffffffffffffffc8;
  int in_stack_ffffffffffffffcc;
  long local_10;
  
  iVar1 = lua_type((lua_State *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
                   in_stack_ffffffffffffffc4);
  if (iVar1 < 1) {
    local_10 = time((time_t *)0x0);
  }
  else {
    luaL_checktype((lua_State *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                   in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8);
    lua_settop((lua_State *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
               in_stack_ffffffffffffffbc);
    in_stack_ffffffffffffffb8 =
         getfield((lua_State *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                  (char *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),0);
    in_stack_ffffffffffffffbc =
         getfield((lua_State *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                  (char *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),0);
    in_stack_ffffffffffffffc0 =
         getfield((lua_State *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                  (char *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),0);
    in_stack_ffffffffffffffc4 =
         getfield((lua_State *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                  (char *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),0);
    getfield((lua_State *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
             (char *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),0);
    getfield((lua_State *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
             (char *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),0);
    getboolfield((lua_State *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                 (char *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
    local_10 = mktime((tm *)&stack0xffffffffffffffb8);
  }
  if (local_10 == -1) {
    lua_pushnil((lua_State *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
  }
  else {
    lua_pushnumber((lua_State *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                   (lua_Number)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
  }
  return 1;
}

Assistant:

LJLIB_CF(os_time)
{
  time_t t;
  if (lua_isnoneornil(L, 1)) {  /* called without args? */
    t = time(NULL);  /* get current time */
  } else {
    struct tm ts;
    luaL_checktype(L, 1, LUA_TTABLE);
    lua_settop(L, 1);  /* make sure table is at the top */
    ts.tm_sec = getfield(L, "sec", 0);
    ts.tm_min = getfield(L, "min", 0);
    ts.tm_hour = getfield(L, "hour", 12);
    ts.tm_mday = getfield(L, "day", -1);
    ts.tm_mon = getfield(L, "month", -1) - 1;
    ts.tm_year = getfield(L, "year", -1) - 1900;
    ts.tm_isdst = getboolfield(L, "isdst");
    t = mktime(&ts);
  }
  if (t == (time_t)(-1))
    lua_pushnil(L);
  else
    lua_pushnumber(L, (lua_Number)t);
  return 1;
}